

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PL_approximation.h
# Opt level: O2

VectorXd __thiscall
Gudhi::coxeter_triangulation::
PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
::operator()(PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
             *this,VectorXd *p)

{
  Scalar SVar1;
  double dVar2;
  double *pdVar3;
  PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  *this_00;
  Scalar *pSVar4;
  Scalar *pSVar5;
  CoeffReturnType pdVar6;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RDX;
  Index extraout_RDX;
  size_t i;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  long col;
  VectorXd VVar10;
  VectorXd z;
  _Vector_base<int,_std::allocator<int>_> local_1e0;
  bool local_1c8;
  PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  *local_1c0;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_1b8;
  VectorXd *local_1b0;
  Vertex_handle *local_1a8;
  MatrixXd vertex_matrix;
  size_t cod_d;
  MatrixXd matrix;
  Simplex_handle s;
  VectorXd fun_v;
  VectorXd pt_v;
  vector<int,_std::allocator<int>_> v;
  VectorXd lambda;
  _Vector_base<int,_std::allocator<int>_> local_f0;
  bool local_d8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_d0;
  undefined1 local_a0 [112];
  
  local_d0.m_rhs = (RhsNested)local_d0.m_lhs;
  cod_d = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  pdVar3 = p[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_1a8 = (Vertex_handle *)(p + 3);
  local_1c0 = this;
  local_1b0 = p;
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<Eigen::Matrix<double,_1,1,0,_1,1>>
            (&s,local_1a8,(Matrix<double,__1,_1,_0,__1,_1> *)in_RDX,1.0);
  local_d0.m_lhs =
       (LhsNested)
       (((long)s.partition_.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)s.partition_.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&matrix,&cod_d,(unsigned_long *)&local_d0);
  piVar9 = (int *)((long)pdVar3 + 1);
  local_d0.m_lhs = (LhsNested)piVar9;
  z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)
       (((long)s.partition_.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)s.partition_.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&vertex_matrix,(unsigned_long *)&local_d0,
             (unsigned_long *)&z);
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)s.partition_.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)s.partition_.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &vertex_matrix,0,uVar7);
    *pSVar4 = 1.0;
  }
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::vertex_range((Vertex_range *)&local_d0,&s);
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::Vertex_iterator((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)&z,(Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           *)&local_d0);
  local_1b8 = in_RDX;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::Vertex_iterator((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)&lambda,
                    (Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     *)local_a0);
  col = 0;
  while ((local_1c8 != true || ((local_d8 & 1U) == 0))) {
    std::vector<int,_std::allocator<int>_>::vector
              (&v,(vector<int,_std::allocator<int>_> *)&local_1e0);
    Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::cartesian_coordinates
              ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *)&pt_v,local_1a8,1.0);
    Function_Sm_in_Rd::operator()((Function_Sm_in_Rd *)&fun_v,local_1b0);
    for (piVar8 = (int *)0x1; piVar8 < piVar9; piVar8 = (int *)((long)piVar8 + 1)) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&pt_v,
                          (Index)((long)piVar8 + 0xffffffffffffffff));
      SVar1 = *pSVar5;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          &vertex_matrix,(Index)piVar8,col);
      *pSVar4 = SVar1;
    }
    for (uVar7 = 0; uVar7 < cod_d; uVar7 = uVar7 + 1) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&fun_v,uVar7
                         );
      SVar1 = *pSVar5;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&matrix,
                          uVar7,col);
      *pSVar4 = SVar1;
    }
    col = col + 1;
    free(fun_v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(pt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&v.super__Vector_base<int,_std::allocator<int>_>);
    Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::increment((Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)&z);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1e0);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base
            ((iterator_range_base<Gudhi::coxeter_triangulation::Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
              *)&local_d0);
  if (col == ((long)s.partition_.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)s.partition_.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>(&z,(unsigned_long *)&local_d0);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&z,0);
    *pSVar5 = 1.0;
    for (piVar8 = (int *)0x1; piVar8 < piVar9; piVar8 = (int *)((long)piVar8 + 1)) {
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         (local_1b8,(Index)((long)piVar8 + 0xffffffffffffffff));
      dVar2 = *pdVar6;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&z,
                          (Index)piVar8);
      *pSVar5 = dVar2;
    }
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_d0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&vertex_matrix);
    v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
         Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
         solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                   ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                    &local_d0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
    this_00 = local_1c0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&lambda,
               (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&v);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
              ((ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0);
    local_d0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&matrix,
                          (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&lambda);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_d0);
    free(lambda.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(vertex_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    free(matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::~Permutahedral_representation(&s);
    VVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    VVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this_00;
    return (VectorXd)VVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    ;
  }
  __assert_fail("j == s.dimension() + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/include/gudhi/Functions/PL_approximation.h"
                ,0x35,
                "Eigen::VectorXd Gudhi::coxeter_triangulation::PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd, Gudhi::coxeter_triangulation::Coxeter_triangulation<>>::operator()(const Eigen::VectorXd &) const [Function_ = Gudhi::coxeter_triangulation::Function_Sm_in_Rd, Triangulation_ = Gudhi::coxeter_triangulation::Coxeter_triangulation<>]"
               );
}

Assistant:

Eigen::VectorXd operator()(const Eigen::VectorXd& p) const {
    std::size_t cod_d = this->cod_d();
    std::size_t amb_d = this->amb_d();
    auto s = tr_.locate_point(p);
    Eigen::MatrixXd matrix(cod_d, s.dimension() + 1);
    Eigen::MatrixXd vertex_matrix(amb_d + 1, s.dimension() + 1);
    for (std::size_t i = 0; i < s.dimension() + 1; ++i) vertex_matrix(0, i) = 1;
    std::size_t j = 0;
    for (auto v : s.vertex_range()) {
      Eigen::VectorXd pt_v = tr_.cartesian_coordinates(v);
      Eigen::VectorXd fun_v = fun_(pt_v);
      for (std::size_t i = 1; i < amb_d + 1; ++i) vertex_matrix(i, j) = pt_v(i - 1);
      for (std::size_t i = 0; i < cod_d; ++i) matrix(i, j) = fun_v(i);
      j++;
    }
    assert(j == s.dimension() + 1);
    Eigen::VectorXd z(amb_d + 1);
    z(0) = 1;
    for (std::size_t i = 1; i < amb_d + 1; ++i) z(i) = p(i - 1);
    Eigen::VectorXd lambda = vertex_matrix.colPivHouseholderQr().solve(z);
    Eigen::VectorXd result = matrix * lambda;
    return result;
  }